

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          StructNew *curr)

{
  Type *this_00;
  ulong uVar1;
  Flow *pFVar2;
  pointer pLVar3;
  pointer pFVar4;
  Literal *pLVar5;
  HeapType type;
  ulong uVar6;
  anon_union_16_5_9943fe1e_for_Literal_0 *this_01;
  HeapType local_108;
  HeapType heapType;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e8;
  Literal local_d0;
  undefined1 local_b8 [8];
  Literals data;
  shared_ptr<wasm::GCData> local_70;
  anon_union_16_5_9943fe1e_for_Literal_0 *local_60;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_58;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *local_50;
  Flow *local_48;
  size_t local_40;
  undefined1 local_31;
  
  local_50 = this;
  local_48 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id == 1) {
    local_40 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    if (local_40 != 0) {
      uVar6 = 0;
      do {
        pFVar2 = local_48;
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar6) goto LAB_0083a038;
        visit(local_48,local_50,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar6]
             );
        if ((pFVar2->breakTo).super_IString.str._M_str != (char *)0x0) {
          return local_48;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        Literal::~Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems);
        uVar6 = uVar6 + 1;
      } while (local_40 != uVar6);
    }
    handle_unreachable("unreachable but no unreachable child",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                       ,0x602);
  }
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type;
  local_108 = wasm::Type::getHeapType(this_00);
  pLVar3 = (pointer)HeapType::getStruct(&local_108);
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_b8,
             (long)(((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
                    &(pLVar3->field_0).gcData.
                     super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)->_M_impl).
                   super__Vector_impl_data._M_finish - (pLVar3->field_0).i64 >> 4);
  pFVar4 = (pointer)(pLVar3->field_0).i64;
  data.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pLVar3;
  if ((((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
       &(pLVar3->field_0).func.super_IString)->_M_impl).super__Vector_impl_data._M_finish != pFVar4)
  {
    local_58 = &(local_48->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
    local_60 = (anon_union_16_5_9943fe1e_for_Literal_0 *)
               &(local_48->values).super_SmallVector<wasm::Literal,_1UL>.fixed;
    local_40 = CONCAT44(local_40._4_4_,1);
    uVar6 = 0;
    do {
      pFVar2 = local_48;
      uVar1 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (uVar1 == 0) {
        Literal::makeZero((Literal *)&local_e8.func,(Type)pFVar4[uVar6].type.id);
        pLVar5 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 uVar6 * 0x18);
        if ((int)local_40 == 1) {
          pLVar5 = (Literal *)&data;
        }
        Literal::operator=(pLVar5,(Literal *)&local_e8.func);
        this_01 = &local_e8;
      }
      else {
        if (uVar1 <= uVar6) {
LAB_0083a038:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        visit(local_48,local_50,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar6]
             );
        if ((pFVar2->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_0083a00a;
        pLVar5 = Flow::getSingleValue(pFVar2);
        Literal::Literal((Literal *)&heapType,pLVar5);
        truncateForPacking((Literal *)&local_e8.func,local_50,(Literal *)&heapType,pFVar4 + uVar6);
        pLVar5 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 uVar6 * 0x18);
        if ((int)local_40 == 1) {
          pLVar5 = (Literal *)&data;
        }
        Literal::operator=(pLVar5,(Literal *)&local_e8.func);
        Literal::~Literal((Literal *)&local_e8.func);
        Literal::~Literal((Literal *)&heapType);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_58);
        this_01 = local_60;
      }
      Literal::~Literal((Literal *)&this_01->func);
      uVar6 = local_40 & 0xffffffff;
      pFVar4 = (pointer)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->field_0).i64;
      local_40 = CONCAT44(local_40._4_4_,(int)local_40 + 1);
    } while (uVar6 < (ulong)((long)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0).
                                   gcData.
                                   super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi - (long)pFVar4 >> 4));
  }
  local_e8.i64 = (int64_t)wasm::Type::getHeapType(this_00);
  local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
            (&local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (GCData **)&local_70,(allocator<wasm::GCData> *)&local_31,(HeapType *)&local_e8.func,
             (Literals *)local_b8);
  type = wasm::Type::getHeapType(this_00);
  pFVar2 = local_48;
  Literal::Literal(&local_d0,&local_70,type);
  Flow::Flow(pFVar2,&local_d0);
  Literal::~Literal(&local_d0);
  if (local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_0083a00a:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&data);
  return local_48;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }